

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O0

void update_parent_ptr(opr_rbtree *head,opr_rbtree_node *old,opr_rbtree_node *replacement)

{
  opr_rbtree_node *replacement_local;
  opr_rbtree_node *old_local;
  opr_rbtree *head_local;
  
  if (old->parent == (opr_rbtree_node *)0x0) {
    head->root = replacement;
  }
  else if (old->parent->left == old) {
    old->parent->left = replacement;
  }
  else {
    old->parent->right = replacement;
  }
  return;
}

Assistant:

static inline void update_parent_ptr(struct opr_rbtree *head,
				     struct opr_rbtree_node *old,
				     struct opr_rbtree_node *replacement)
{
	if (old->parent) {
		if (old->parent->left == old)
			old->parent->left = replacement;
		else
			old->parent->right = replacement;
	} else
		head->root = replacement;
}